

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

cupdlp_int cupdlp_dot(CUPDLPwork *w,cupdlp_int n,cupdlp_float *x,cupdlp_float *y,cupdlp_float *res)

{
  cupdlp_float *in_RCX;
  cupdlp_float *in_RDX;
  cupdlp_int in_ESI;
  double *in_R8;
  double dVar1;
  
  dVar1 = dot(in_ESI,in_RDX,1,in_RCX,1);
  *in_R8 = dVar1;
  return 0;
}

Assistant:

cupdlp_int cupdlp_dot(CUPDLPwork *w, const cupdlp_int n, const cupdlp_float *x,
                      const cupdlp_float *y, cupdlp_float *res) {
#ifndef CUPDLP_CPU
#ifndef SFLOAT
  CHECK_CUBLAS(cublasDdot(w->cublashandle, n, x, 1, y, 1, res));
#else
  CHECK_CUBLAS(cublasSdot(w->cublashandle, n, x, 1, y, 1 res));
#endif
#else
  *res = dot(n, x, 1, y, 1);
#endif
  return 0;
}